

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O0

void tryprocstatus(FILE *out)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  FILE *in_RDI;
  char *end;
  char *strt;
  size_t skip;
  FILE *in;
  int n;
  char buf [256];
  char local_108 [96];
  char *in_stack_ffffffffffffff58;
  
  uVar2 = getpid();
  iVar3 = snprintf(local_108,0x100,"/proc/%d/status",(ulong)uVar2);
  if (((0 < iVar3) && (iVar3 < 0x101)) && (bVar1 = fileexists(in_stack_ffffffffffffff58), bVar1)) {
    __stream = fopen(local_108,"r");
    do {
      pcVar4 = fgets(local_108,0x100,__stream);
      if (pcVar4 == (char *)0x0) goto LAB_00102309;
      pcVar4 = strstr(local_108,tryprocstatus::field);
    } while (pcVar4 == (char *)0x0);
    sVar5 = strlen(tryprocstatus::field);
    sVar5 = strspn(local_108 + sVar5," \t");
    sVar6 = strlen(tryprocstatus::field);
    pcVar4 = strchr(local_108 + sVar5 + sVar6,0x20);
    *pcVar4 = '\0';
    dfpair(in_RDI,tryprocstatus::key,"%s",local_108 + sVar5 + sVar6);
LAB_00102309:
    fclose(__stream);
  }
  return;
}

Assistant:

static void tryprocstatus(FILE *out)
{
	static const char *field = "VmPeak:";
	static const char *key = "max virtual kilobytes";
	char buf[Bufsz];

	int n = snprintf(buf, Bufsz, "/proc/%d/status", getpid());
	if (n <= 0 || n > Bufsz)
		return;

	if (!fileexists(buf))
		return;

	FILE *in = fopen(buf, "r");

	for (;;) {
		if (!fgets(buf, Bufsz, in))
			break;
		if (!strstr(buf, field))
			continue;
		size_t skip = strspn(buf + strlen(field), " \t");
		char *strt = buf + strlen(field) + skip;
		char *end = strchr(strt, ' ');
		*end = '\0';
		dfpair(out, key, "%s", strt);
		break;
	}

	fclose(in);
}